

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O1

double GetCombinedEntropy(uint32_t *X,uint32_t *Y,int length,int is_X_used,int is_Y_used,
                         int trivial_at_end)

{
  undefined4 uVar1;
  undefined4 uVar2;
  double dVar3;
  VP8LStreaks stats;
  VP8LBitEntropy bit_entropy;
  VP8LStreaks local_38;
  VP8LBitEntropy local_18;
  
  if (trivial_at_end != 0) {
    return (double)(length + -1) * 0.234375 + 1.5625 + 47.9 + 0.0 + 0.0 + 3.28125;
  }
  if (is_X_used == 0) {
    X = Y;
    if (is_Y_used != 0) goto LAB_001436d7;
    local_38.streaks[0][0] = 0;
    local_38.streaks[0][1] = 0;
    local_38.streaks[1][0] = 0;
    local_38.streaks[1][1] = 0;
    local_38.counts[0] = 1;
    local_38.counts[1] = 0;
    local_38.streaks[0][3 < length] = length;
    VP8LBitEntropyInit(&local_18);
  }
  else if (is_Y_used == 0) {
LAB_001436d7:
    (*VP8LGetEntropyUnrefined)(X,length,&local_18,&local_38);
  }
  else {
    (*VP8LGetCombinedEntropyUnrefined)(X,Y,length,&local_18,&local_38);
  }
  if (local_18.nonzeros < 5) {
    dVar3 = 0.0;
    if (local_18.nonzeros < 2) goto LAB_00143798;
    if (local_18.nonzeros == 3) {
      uVar1 = 0x66666666;
      uVar2 = 0x3fee6666;
    }
    else {
      if (local_18.nonzeros == 2) {
        dVar3 = (double)local_18.sum * 0.99 + local_18.entropy * 0.01;
        goto LAB_00143798;
      }
      uVar1 = 0x66666666;
      uVar2 = 0x3fe66666;
    }
  }
  else {
    uVar1 = 0x4dd2f1aa;
    uVar2 = 0x3fe41062;
  }
  dVar3 = (double)(local_18.sum * 2 - local_18.max_val) * (double)CONCAT44(uVar2,uVar1) +
          (1.0 - (double)CONCAT44(uVar2,uVar1)) * local_18.entropy;
  if (dVar3 <= local_18.entropy) {
    dVar3 = local_18.entropy;
  }
LAB_00143798:
  return (double)local_38.streaks[1][0] * 3.28125 +
         (double)local_38.streaks[0][0] * 1.796875 +
         (double)local_38.counts[1] * 2.578125 + (double)local_38.streaks[1][1] * 0.703125 +
         (double)local_38.counts[0] * 1.5625 + (double)local_38.streaks[0][1] * 0.234375 + 47.9 +
         dVar3;
}

Assistant:

static WEBP_INLINE double GetCombinedEntropy(const uint32_t* const X,
                                             const uint32_t* const Y,
                                             int length, int is_X_used,
                                             int is_Y_used,
                                             int trivial_at_end) {
  VP8LStreaks stats;
  if (trivial_at_end) {
    // This configuration is due to palettization that transforms an indexed
    // pixel into 0xff000000 | (pixel << 8) in VP8LBundleColorMap.
    // BitsEntropyRefine is 0 for histograms with only one non-zero value.
    // Only FinalHuffmanCost needs to be evaluated.
    memset(&stats, 0, sizeof(stats));
    // Deal with the non-zero value at index 0 or length-1.
    stats.streaks[1][0] = 1;
    // Deal with the following/previous zero streak.
    stats.counts[0] = 1;
    stats.streaks[0][1] = length - 1;
    return FinalHuffmanCost(&stats);
  } else {
    VP8LBitEntropy bit_entropy;
    if (is_X_used) {
      if (is_Y_used) {
        VP8LGetCombinedEntropyUnrefined(X, Y, length, &bit_entropy, &stats);
      } else {
        VP8LGetEntropyUnrefined(X, length, &bit_entropy, &stats);
      }
    } else {
      if (is_Y_used) {
        VP8LGetEntropyUnrefined(Y, length, &bit_entropy, &stats);
      } else {
        memset(&stats, 0, sizeof(stats));
        stats.counts[0] = 1;
        stats.streaks[0][length > 3] = length;
        VP8LBitEntropyInit(&bit_entropy);
      }
    }

    return BitsEntropyRefine(&bit_entropy) + FinalHuffmanCost(&stats);
  }
}